

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

HRESULT __thiscall
NativeCodeGenerator::JitFromEncodedWorkItem(NativeCodeGenerator *this,byte *buffer,uint bufferSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *this_00;
  PageAllocator *pageAllocator;
  undefined1 local_c8 [8];
  JITOutputIDL jitOutput;
  CodeGenWorkItemIDL *pCStack_30;
  HRESULT hr;
  CodeGenWorkItemIDL *workItemData;
  byte *pbStack_20;
  uint bufferSize_local;
  byte *buffer_local;
  NativeCodeGenerator *this_local;
  
  pCStack_30 = (CodeGenWorkItemIDL *)0x0;
  workItemData._4_4_ = bufferSize;
  pbStack_20 = buffer;
  buffer_local = (byte *)this;
  jitOutput.startTime._4_4_ =
       JITManager::DeserializeRPCData(buffer,bufferSize,&stack0xffffffffffffffd0);
  this_local._4_4_ = jitOutput.startTime._4_4_;
  if (-1 < jitOutput.startTime._4_4_) {
    if (pCStack_30 == (CodeGenWorkItemIDL *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x1e9,"(workItemData)","workItemData");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    memset(local_c8,0,0x90);
    this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
    pageAllocator = ThreadContext::GetPageAllocator(this_00);
    CodeGen(this,pageAllocator,pCStack_30,(JITOutputIDL *)local_c8,true,(EntryPointInfo *)0x0);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

HRESULT NativeCodeGenerator::JitFromEncodedWorkItem(_In_reads_(bufferSize) const byte* buffer, _In_ uint bufferSize)
{
    CodeGenWorkItemIDL* workItemData = nullptr;
    HRESULT hr = JITManager::DeserializeRPCData(buffer, bufferSize, &workItemData);
    if (FAILED(hr))
    {
        return hr;
    }
    AssertOrFailFast(workItemData);
    JITOutputIDL jitOutput = { 0 };
    CodeGen(scriptContext->GetThreadContext()->GetPageAllocator(), workItemData, jitOutput, true);
    return S_OK;
}